

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coverage.cpp
# Opt level: O3

void __thiscall Coverage_unitsItem_Test::~Coverage_unitsItem_Test(Coverage_unitsItem_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Coverage, unitsItem)
{
    auto units = libcellml::Units::create("units");
    units->addUnit("second");

    auto unitsItemValid = libcellml::UnitsItem::create(units, 0);
    auto unitsItemInvalid = libcellml::UnitsItem::create(nullptr, 0);

    EXPECT_TRUE(unitsItemValid->isValid());
    EXPECT_FALSE(unitsItemInvalid->isValid());
}